

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

StreamOut * initStreamOut(TidyDocImpl *doc,int encoding,uint nl)

{
  StreamOut *__s;
  StreamOut *out;
  uint nl_local;
  int encoding_local;
  TidyDocImpl *doc_local;
  
  __s = (StreamOut *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x20);
  memset(__s,0,0x20);
  __s->encoding = encoding;
  __s->state = FSM_ASCII;
  __s->nl = nl;
  return __s;
}

Assistant:

static StreamOut* initStreamOut( TidyDocImpl* doc, int encoding, uint nl )
{
    StreamOut* out = (StreamOut*) TidyDocAlloc( doc, sizeof(StreamOut) );
    TidyClearMemory( out, sizeof(StreamOut) );
    out->encoding = encoding;
    out->state = FSM_ASCII;
    out->nl = nl;
    return out;
}